

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbuttongroup.cpp
# Opt level: O3

int __thiscall QButtonGroup::checkedId(QButtonGroup *this)

{
  long lVar1;
  Node<QAbstractButton_*,_int> *pNVar2;
  int iVar3;
  long in_FS_OFFSET;
  QAbstractButton *local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&this->field_0x8;
  if ((*(long *)(lVar1 + 0x90) == 0) || (*(int *)(*(long *)(lVar1 + 0x90) + 4) == 0)) {
    local_18 = (QAbstractButton *)0x0;
  }
  else {
    local_18 = *(QAbstractButton **)(lVar1 + 0x98);
  }
  iVar3 = -1;
  if (*(Data<QHashPrivate::Node<QAbstractButton*,int>> **)(lVar1 + 0xa8) !=
      (Data<QHashPrivate::Node<QAbstractButton*,int>> *)0x0) {
    pNVar2 = QHashPrivate::Data<QHashPrivate::Node<QAbstractButton*,int>>::
             findNode<QAbstractButton*>
                       (*(Data<QHashPrivate::Node<QAbstractButton*,int>> **)(lVar1 + 0xa8),&local_18
                       );
    if (pNVar2 != (Node<QAbstractButton_*,_int> *)0x0) {
      iVar3 = pNVar2->value;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return iVar3;
  }
  __stack_chk_fail();
}

Assistant:

int QButtonGroup::checkedId() const
{
    Q_D(const QButtonGroup);
    return d->mapping.value(d->checkedButton, -1);
}